

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall tcu::Texture3D::allocLevel(Texture3D *this,int levelNdx)

{
  int width_00;
  int height_00;
  int depth_00;
  int depth;
  int height;
  int width;
  int levelNdx_local;
  Texture3D *this_local;
  
  width_00 = getMipPyramidLevelSize(this->m_width,levelNdx);
  height_00 = getMipPyramidLevelSize(this->m_height,levelNdx);
  depth_00 = getMipPyramidLevelSize(this->m_depth,levelNdx);
  TextureLevelPyramid::allocLevel
            (&this->super_TextureLevelPyramid,levelNdx,width_00,height_00,depth_00);
  return;
}

Assistant:

void Texture3D::allocLevel (int levelNdx)
{
	DE_ASSERT(de::inBounds(levelNdx, 0, getNumLevels()));

	const int width		= getMipPyramidLevelSize(m_width,	levelNdx);
	const int height	= getMipPyramidLevelSize(m_height,	levelNdx);
	const int depth		= getMipPyramidLevelSize(m_depth,	levelNdx);

	TextureLevelPyramid::allocLevel(levelNdx, width, height, depth);
}